

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          BaseTextGenerator *generator)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  bool bVar3;
  byte extraout_AL;
  byte bVar4;
  uint uVar5;
  FastFieldValuePrinter *pFVar6;
  Message *message_00;
  uint64_t uVar7;
  string *this_00;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar8;
  _func_int *UNRECOVERED_JUMPTABLE;
  long *plVar9;
  Nonnull<char_*> pcVar10;
  long lVar11;
  Nonnull<const_char_*> pcVar12;
  byte v1;
  long *plVar13;
  FieldDescriptor *message_01;
  ulong uVar14;
  _Alloc_hider _Var15;
  float fVar16;
  string_view str;
  string scratch;
  string truncated_value;
  string local_c0;
  string local_90;
  LogMessageFatal local_70;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  bVar3 = (bool)((field->field_0x1 & 0x20) >> 5);
  if (0xbf < (byte)field->field_0x1 != bVar3) {
    PrintFieldValue();
LAB_002513cf:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0xa90,"field->is_repeated() || (index == -1)");
    str._M_str = "Index must be -1 for non-repeated fields";
    str._M_len = 0x28;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_c0,str);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_c0);
  }
  if (index != -1 && bVar3 == false) goto LAB_002513cf;
  message_01 = field;
  pFVar6 = GetFieldPrinter(this,field);
  bVar3 = TryRedactFieldValue(this,(Message *)message_01,field,generator,false);
  if (bVar3) {
    return;
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    bVar4 = field->field_0x1;
    v1 = (bVar4 & 0x20) >> 5;
    if (0xbf < bVar4 == (bool)v1) {
      if ((bVar4 & 0x20) == 0) {
        uVar5 = Reflection::GetInt32(reflection,message,field);
      }
      else {
        uVar5 = Reflection::GetRepeatedInt32(reflection,message,field,index);
      }
      UNRECOVERED_JUMPTABLE = pFVar6->_vptr_FastFieldValuePrinter[3];
LAB_0025117c:
      uVar14 = (ulong)uVar5;
LAB_002511e2:
      (*UNRECOVERED_JUMPTABLE)(pFVar6,uVar14,generator,UNRECOVERED_JUMPTABLE);
      return;
    }
    goto LAB_00251471;
  case 2:
    bVar4 = field->field_0x1;
    v1 = (bVar4 & 0x20) >> 5;
    if (0xbf < bVar4 == (bool)v1) {
      if ((bVar4 & 0x20) == 0) {
        uVar7 = Reflection::GetInt64(reflection,message,field);
      }
      else {
        uVar7 = Reflection::GetRepeatedInt64(reflection,message,field,index);
      }
      UNRECOVERED_JUMPTABLE = pFVar6->_vptr_FastFieldValuePrinter[5];
LAB_00251190:
      (*UNRECOVERED_JUMPTABLE)(pFVar6,uVar7,generator,UNRECOVERED_JUMPTABLE);
      return;
    }
    goto LAB_00251486;
  case 3:
    bVar4 = field->field_0x1;
    v1 = (bVar4 & 0x20) >> 5;
    if (0xbf < bVar4 == (bool)v1) {
      if ((bVar4 & 0x20) == 0) {
        uVar5 = Reflection::GetUInt32(reflection,message,field);
      }
      else {
        uVar5 = Reflection::GetRepeatedUInt32(reflection,message,field,index);
      }
      UNRECOVERED_JUMPTABLE = pFVar6->_vptr_FastFieldValuePrinter[4];
      goto LAB_0025117c;
    }
    goto LAB_00251432;
  case 4:
    bVar4 = field->field_0x1;
    v1 = (bVar4 & 0x20) >> 5;
    if (0xbf < bVar4 == (bool)v1) {
      if ((bVar4 & 0x20) == 0) {
        uVar7 = Reflection::GetUInt64(reflection,message,field);
      }
      else {
        uVar7 = Reflection::GetRepeatedUInt64(reflection,message,field,index);
      }
      UNRECOVERED_JUMPTABLE = pFVar6->_vptr_FastFieldValuePrinter[6];
      goto LAB_00251190;
    }
    goto LAB_00251447;
  case 5:
    bVar4 = field->field_0x1;
    v1 = (bVar4 & 0x20) >> 5;
    if (0xbf < bVar4 == (bool)v1) {
      if ((bVar4 & 0x20) == 0) {
        dVar2 = Reflection::GetDouble(reflection,message,field);
        fVar16 = SUB84(dVar2,0);
      }
      else {
        dVar2 = Reflection::GetRepeatedDouble(reflection,message,field,index);
        fVar16 = SUB84(dVar2,0);
      }
      UNRECOVERED_JUMPTABLE = pFVar6->_vptr_FastFieldValuePrinter[8];
LAB_002511b9:
      (*UNRECOVERED_JUMPTABLE)(fVar16,pFVar6,generator);
      return;
    }
    PrintFieldValue();
    break;
  case 6:
    bVar4 = field->field_0x1;
    v1 = (bVar4 & 0x20) >> 5;
    if (0xbf < bVar4 == (bool)v1) {
      if ((bVar4 & 0x20) == 0) {
        fVar16 = Reflection::GetFloat(reflection,message,field);
      }
      else {
        fVar16 = Reflection::GetRepeatedFloat(reflection,message,field,index);
      }
      UNRECOVERED_JUMPTABLE = pFVar6->_vptr_FastFieldValuePrinter[7];
      goto LAB_002511b9;
    }
    goto LAB_0025149b;
  case 7:
    bVar4 = field->field_0x1;
    v1 = (bVar4 & 0x20) >> 5;
    if (0xbf < bVar4 == (bool)v1) {
      if ((bVar4 & 0x20) == 0) {
        bVar3 = Reflection::GetBool(reflection,message,field);
      }
      else {
        bVar3 = Reflection::GetRepeatedBool(reflection,message,field,index);
      }
      UNRECOVERED_JUMPTABLE = pFVar6->_vptr_FastFieldValuePrinter[2];
      uVar14 = (ulong)bVar3;
      goto LAB_002511e2;
    }
    goto LAB_002514b0;
  case 8:
    bVar4 = field->field_0x1;
    v1 = (bVar4 & 0x20) >> 5;
    if (0xbf < bVar4 == (bool)v1) {
      if ((bVar4 & 0x20) == 0) {
        uVar5 = Reflection::GetEnumValue(reflection,message,field);
      }
      else {
        uVar5 = Reflection::GetRepeatedEnumValue(reflection,message,field,index);
      }
      this_01 = FieldDescriptor::enum_type(field);
      pEVar8 = EnumDescriptor::FindValueByNumber(this_01,uVar5);
      if (pEVar8 != (EnumValueDescriptor *)0x0) {
        (*pFVar6->_vptr_FastFieldValuePrinter[0xb])
                  (pFVar6,(ulong)uVar5,pEVar8->all_names_,generator);
        return;
      }
      paVar1 = &local_c0.field_2;
      pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer(uVar5,paVar1->_M_local_buf);
      local_c0._M_dataplus._M_p = pcVar10 + -(long)paVar1;
      local_c0._M_string_length = (size_type)paVar1;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,paVar1,pcVar10);
      (*pFVar6->_vptr_FastFieldValuePrinter[0xb])(pFVar6,(ulong)uVar5,&local_90,generator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        return;
      }
      lVar11 = CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                        local_90.field_2._M_local_buf[0]);
      _Var15._M_p = local_90._M_dataplus._M_p;
      goto LAB_002513ac;
    }
    goto LAB_0025145c;
  case 9:
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    bVar4 = field->field_0x1;
    v1 = (bVar4 & 0x20) >> 5;
    if (0xbf < bVar4 != (bool)v1) goto LAB_002514c5;
    if ((bVar4 & 0x20) == 0) {
      this_00 = Reflection::GetStringReference(reflection,message,field,&local_c0);
    }
    else {
      this_00 = Reflection::GetRepeatedStringReference(reflection,message,field,index,&local_c0);
    }
    paVar1 = &local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)paVar1;
    if ((0 < this->truncate_string_field_longer_than_) &&
       ((ulong)this->truncate_string_field_longer_than_ < this_00->_M_string_length)) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)this_00);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_60 = *plVar13;
        lStack_58 = plVar9[3];
        local_70.super_LogMessage._0_8_ = &local_60;
      }
      else {
        local_60 = *plVar13;
        local_70.super_LogMessage._0_8_ = (long *)*plVar9;
      }
      local_70.super_LogMessage.data_._M_t.
      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      this_00 = &local_90;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_70);
      if ((long *)local_70.super_LogMessage._0_8_ != &local_60) {
        operator_delete((void *)local_70.super_LogMessage._0_8_,local_60 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
    bVar4 = field->type_;
    lVar11 = 0x48;
    if (bVar4 != 9) {
      if (bVar4 != 0xc) {
        pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)bVar4,0xc,"field->type() == FieldDescriptor::TYPE_BYTES");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                   ,0xabf,pcVar12);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_70);
      }
      lVar11 = 0x50;
    }
    (**(code **)((long)pFVar6->_vptr_FastFieldValuePrinter + lVar11))(pFVar6,this_00,generator);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
      return;
    }
    lVar11 = CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,local_c0.field_2._M_local_buf[0])
    ;
    _Var15._M_p = local_c0._M_dataplus._M_p;
LAB_002513ac:
    operator_delete(_Var15._M_p,lVar11 + 1);
switchD_00250e8d_default:
    return;
  case 10:
    bVar4 = field->field_0x1;
    v1 = (bVar4 & 0x20) >> 5;
    if (0xbf < bVar4 == (bool)v1) {
      if ((bVar4 & 0x20) == 0) {
        message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
      }
      else {
        message_00 = Reflection::GetRepeatedMessage(reflection,message,field,index);
      }
      Print(this,message_00,generator);
      return;
    }
    break;
  default:
    goto switchD_00250e8d_default;
  }
  PrintFieldValue();
LAB_00251432:
  PrintFieldValue();
LAB_00251447:
  PrintFieldValue();
LAB_0025145c:
  PrintFieldValue();
LAB_00251471:
  PrintFieldValue();
LAB_00251486:
  PrintFieldValue();
LAB_0025149b:
  PrintFieldValue();
LAB_002514b0:
  PrintFieldValue();
  bVar4 = extraout_AL;
LAB_002514c5:
  pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                      ((bool)v1,0xbf < bVar4,
                       "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb54,pcVar12);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_90);
}

Assistant:

void TextFormat::Printer::PrintFieldValue(const Message& message,
                                          const Reflection* reflection,
                                          const FieldDescriptor* field,
                                          int index,
                                          BaseTextGenerator* generator) const {
  ABSL_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);
  if (TryRedactFieldValue(message, field, generator,
                          /*insert_value_separator=*/false)) {
    return;
  }

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                           \
    printer->Print##METHOD(                                          \
        field->is_repeated()                                         \
            ? reflection->GetRepeated##METHOD(message, field, index) \
            : reflection->Get##METHOD(message, field),               \
        generator);                                                  \
    break

    OUTPUT_FIELD(INT32, Int32);
    OUTPUT_FIELD(INT64, Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD(FLOAT, Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(BOOL, Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      std::string scratch;
      const std::string& value =
          field->is_repeated()
              ? reflection->GetRepeatedStringReference(message, field, index,
                                                       &scratch)
              : reflection->GetStringReference(message, field, &scratch);
      const std::string* value_to_print = &value;
      std::string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          static_cast<size_t>(truncate_string_field_longer_than_) <
              value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        printer->PrintString(*value_to_print, generator);
      } else {
        ABSL_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        printer->PrintBytes(*value_to_print, generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value =
          field->is_repeated()
              ? reflection->GetRepeatedEnumValue(message, field, index)
              : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != nullptr) {
        printer->PrintEnum(enum_value, internal::NameOfEnumAsString(enum_desc),
                           generator);
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        printer->PrintEnum(enum_value, absl::StrCat(enum_value), generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
                ? reflection->GetRepeatedMessage(message, field, index)
                : reflection->GetMessage(message, field),
            generator);
      break;
  }
}